

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::SReadMemTask::checkArguments
          (SReadMemTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Expression *arg;
  ulong uVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,4,0x7fffffff);
  if (!bVar2) {
    return pCVar1->errorType;
  }
  bVar2 = Type::isUnpackedArray(((*args->_M_ptr)->type).ptr);
  arg = args->_M_ptr[1];
  if (bVar2) {
    bVar2 = Type::isNumeric((arg->type).ptr);
    if (bVar2) {
      bVar2 = Type::isNumeric((args->_M_ptr[2]->type).ptr);
      if (bVar2) {
        if (3 < (args->_M_extent)._M_extent_value) {
          uVar4 = 3;
          do {
            bVar2 = Type::canBeStringLike((args->_M_ptr[uVar4]->type).ptr);
            if (!bVar2) {
              arg = args->_M_ptr[uVar4];
              goto LAB_004ae5b8;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < (args->_M_extent)._M_extent_value);
        }
        return pCVar1->voidType;
      }
      arg = args->_M_ptr[2];
    }
    else {
      arg = args->_M_ptr[1];
    }
  }
LAB_004ae5b8:
  pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 4, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isUnpackedArray())
            return badArg(context, *args[1]);

        if (!args[1]->type->isNumeric())
            return badArg(context, *args[1]);

        if (!args[2]->type->isNumeric())
            return badArg(context, *args[2]);

        for (size_t i = 3; i < args.size(); i++) {
            if (!args[i]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }